

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

int lyd_validate_value(lys_node *node,char *value)

{
  lys_type *plVar1;
  int local_7c;
  lys_node *plStack_78;
  int ret;
  lys_node_leaf *sleaf;
  lyd_node_leaf_list leaf;
  char *value_local;
  lys_node *node_local;
  
  local_7c = 0;
  leaf._72_8_ = value;
  if ((node == (lys_node *)0x0) || ((node->nodetype & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN)) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lyd_validate_value");
    node_local._4_4_ = 1;
  }
  else {
    if (value == (char *)0x0) {
      leaf._72_8_ = (long)" \t\n" + 3;
    }
    memset(&sleaf,0,0x50);
    leaf._48_8_ = lydict_insert(node->module->ctx,(char *)leaf._72_8_,0);
    for (plStack_78 = node; leaf.value.int32 = *(undefined4 *)&plStack_78[1].ref,
        sleaf = (lys_node_leaf *)node, leaf.value.int32 == 9;
        plStack_78 = *(lys_node **)&plStack_78[1].nodetype) {
      if (*(long *)&plStack_78[1].nodetype == 0) {
        ly_log(node->module->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
               ,0x14b3);
        local_7c = 1;
        goto LAB_001a3af5;
      }
    }
    plVar1 = lyp_parse_value((lys_type *)&plStack_78[1].ref,(char **)&leaf.hash,(lyxml_elem *)0x0,
                             (lyd_node_leaf_list *)&sleaf,(lyd_attr *)0x0,(lys_module *)0x0,0,0,0);
    if (plVar1 == (lys_type *)0x0) {
      local_7c = 1;
    }
LAB_001a3af5:
    lydict_remove(node->module->ctx,(char *)leaf._48_8_);
    node_local._4_4_ = local_7c;
  }
  return node_local._4_4_;
}

Assistant:

API int
lyd_validate_value(struct lys_node *node, const char *value)
{
    struct lyd_node_leaf_list leaf;
    struct lys_node_leaf *sleaf = (struct lys_node_leaf*)node;
    int ret = EXIT_SUCCESS;

    if (!node || !(node->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
        LOGARG;
        return EXIT_FAILURE;
    }

    if (!value) {
        value = "";
    }

    /* dummy leaf */
    memset(&leaf, 0, sizeof leaf);
    leaf.value_str = lydict_insert(node->module->ctx, value, 0);

repeat:
    leaf.value_type = sleaf->type.base;
    leaf.schema = node;

    if (leaf.value_type == LY_TYPE_LEAFREF) {
        if (!sleaf->type.info.lref.target) {
            /* it should either be unresolved leafref (leaf.value_type are ORed flags) or it will be resolved */
            LOGINT(node->module->ctx);
            ret = EXIT_FAILURE;
            goto cleanup;
        }
        sleaf = sleaf->type.info.lref.target;
        goto repeat;
    } else {
        if (!lyp_parse_value(&sleaf->type, &leaf.value_str, NULL, &leaf, NULL, NULL, 0, 0, 0)) {
            ret = EXIT_FAILURE;
            goto cleanup;
        }
    }

cleanup:
    lydict_remove(node->module->ctx, leaf.value_str);
    return ret;
}